

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O2

string * __thiscall Noise::getParameter(string *__return_storage_ptr__,Noise *this,string *name)

{
  bool bVar1;
  long lVar2;
  stringstream param;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = std::operator==(name,"mean");
  lVar2 = 0x170;
  if (!bVar1) {
    bVar1 = std::operator==(name,"std.dev.");
    lVar2 = 0x168;
    if (!bVar1) {
      bVar1 = std::operator==(name,"weight");
      lVar2 = 0x158;
      if (!bVar1) {
        bVar1 = std::operator==(name,"rate");
        lVar2 = 0x160;
        if (!bVar1) {
          Parametric::getParameter(&local_1c0,(Parametric *)this,name);
          std::operator<<(&local_190,(string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          goto LAB_001369f3;
        }
      }
    }
  }
  std::ostream::_M_insert<double>
            (*(double *)
              ((long)&(this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                      _vptr_Parametric + lVar2));
LAB_001369f3:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string Noise::getParameter( const string& name ) const
{
	stringstream param;
	if (name == "mean")
		param << noiseMu;
	else if (name == "std.dev.")
		param << noiseSigma;
	else if (name == "weight")
		param << noiseWeight;
	else if (name == "rate")
		param << noiseRate;
	else
		param << StochasticVariable::getParameter(name);
		
	return param.str();
}